

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteUInt32
               (int field_number,uint32 value,CodedOutputStream *output)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar6 = (ulong)value;
  uVar7 = field_number << 3;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar7);
    iVar3 = output->buffer_size_;
  }
  else {
    pbVar1 = output->buffer_;
    pbVar4 = pbVar1;
    uVar5 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar4 = (byte)uVar7 | 0x80;
        uVar5 = uVar7 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar5;
      } while (bVar2);
    }
    *pbVar4 = (byte)uVar5;
    iVar3 = ((int)pbVar4 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar3;
    iVar3 = output->buffer_size_ - iVar3;
    output->buffer_size_ = iVar3;
  }
  if (iVar3 < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,value);
    return;
  }
  pbVar1 = output->buffer_;
  pbVar4 = pbVar1;
  if (0x7f < value) {
    do {
      uVar7 = (uint)uVar6;
      *pbVar4 = (byte)uVar6 | 0x80;
      uVar6 = uVar6 >> 7;
      pbVar4 = pbVar4 + 1;
    } while (0x3fff < uVar7);
  }
  *pbVar4 = (byte)uVar6;
  iVar3 = ((int)pbVar4 - (int)pbVar1) + 1;
  output->buffer_ = output->buffer_ + iVar3;
  output->buffer_size_ = output->buffer_size_ - iVar3;
  return;
}

Assistant:

void WireFormatLite::WriteUInt32(int field_number, uint32 value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteUInt32NoTag(value, output);
}